

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int handle_wedge_inter_intra_mode
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MB_MODE_INFO *mbmi,int *rate_mv,
              INTERINTRA_MODE *best_interintra_mode,int64_t *best_rd,BUFFER_SET *orig_dst,
              uint8_t *tmp_buf_,uint8_t *tmp_buf,uint8_t *intrapred_,uint8_t *intrapred,
              HandleInterModeArgs *args,int *tmp_rate_mv,int *rate_overhead,int_mv *tmp_mv,
              int64_t best_rd_no_wedge)

{
  uint uVar1;
  uint uVar2;
  int *plane_rate;
  int64_t *skip_sse_sb_00;
  uint8_t *skip_txfm_sb_00;
  int64_t *best_interintra_rd;
  int64_t iVar3;
  AV1_COMP *cpi_00;
  long in_RCX;
  BLOCK_SIZE in_DL;
  long in_RSI;
  long in_RDI;
  int64_t *in_R8;
  int64_t *in_R9;
  long *in_stack_00000008;
  int64_t tmp_rd_thresh;
  int64_t mode_rd;
  RD_STATS rd_stats;
  int mi_col;
  int mi_row;
  uint8_t *mask;
  int64_t skip_sse_sb;
  int64_t dist_sum;
  uint8_t skip_txfm_sb;
  int rate_sum;
  int_mv mv0;
  int64_t rd;
  INTERINTRA_MODE cur_mode;
  int best_wedge_index;
  int best_mode;
  int try_smooth_interintra;
  int bw;
  AV1_COMMON *cm;
  int *interintra_mode_cost;
  ModeCosts *mode_costs;
  MACROBLOCKD *xd;
  uint8_t *in_stack_00000190;
  uint8_t *in_stack_00000198;
  MV *in_stack_000001a0;
  BLOCK_SIZE in_stack_000001af;
  MACROBLOCK *in_stack_000001b0;
  AV1_COMP *in_stack_000001b8;
  int in_stack_000001d0;
  int *in_stack_000001d8;
  int in_stack_000001e0;
  uint8_t *in_stack_0000ff38;
  uint8_t *in_stack_0000ff40;
  BLOCK_SIZE in_stack_0000ff4f;
  MACROBLOCK *in_stack_0000ff50;
  AV1_COMP *in_stack_0000ff58;
  RD_STATS *in_stack_fffffffffffffef8;
  int64_t in_stack_ffffffffffffff00;
  MACROBLOCK *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  BLOCK_SIZE BVar4;
  BUFFER_SET *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  AV1_COMMON *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  AV1_COMP *in_stack_ffffffffffffff50;
  MB_MODE_INFO *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  BLOCK_SIZE BVar5;
  MACROBLOCKD *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar6;
  int *in_stack_ffffffffffffff78;
  long lVar7;
  BLOCK_SIZE in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff81;
  byte in_stack_ffffffffffffff87;
  undefined1 uVar8;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar9;
  
  BVar4 = (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff10 >> 0x38);
  plane_rate = (int *)(in_RSI + 0x1a0);
  skip_sse_sb_00 = (int64_t *)(in_RSI + 0x4230);
  skip_txfm_sb_00 = (uint8_t *)(in_RSI + 0x8968 + (ulong)""[in_DL] * 0x10);
  best_interintra_rd = (int64_t *)(in_RDI + 0x3bf80);
  uVar1 = (uint)block_size_wide[in_DL];
  uVar2 = (uint)(*(byte *)(in_RDI + 0x426fa) & 1);
  *(ushort *)(in_RCX + 0xa7) = *(ushort *)(in_RCX + 0xa7) & 0xfbff | 0x400;
  if (*(int *)(in_RDI + 0x60af0) == 0) {
    iVar9 = 0;
    uVar8 = 0;
    in_stack_fffffffffffffef8 =
         (RD_STATS *)CONCAT44((int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(uint)in_DL);
    iVar3 = compute_best_wedge_interintra
                      (in_stack_ffffffffffffff50,
                       (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                       ,(MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                       ,(MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (int *)in_stack_ffffffffffffff30,
                       (BUFFER_SET *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (uint8_t *)in_stack_ffffffffffffff68,
                       (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    BVar5 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff3c >> 0x18);
    *in_stack_00000008 = iVar3;
    *(char *)(in_RCX + 0x40) = (char)iVar9;
    *(undefined1 *)(in_RCX + 0x41) = uVar8;
    if (iVar9 != 3) {
      av1_build_intra_predictors_for_interintra
                ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,(BLOCK_SIZE)((uint)in_stack_ffffffffffffff64 >> 0x18),
                 in_stack_ffffffffffffff60,(BUFFER_SET *)in_stack_ffffffffffffff58,
                 (uint8_t *)in_stack_ffffffffffffff50,(int)skip_txfm_sb_00);
    }
  }
  else if (uVar2 == 0) {
    BVar5 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff64 >> 0x18);
    if ((char)*in_R9 == '\x04') {
      *(undefined1 *)(in_RCX + 0x40) = 3;
      *(char *)in_R9 = '\x03';
      av1_build_intra_predictors_for_interintra
                ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,BVar5,in_stack_ffffffffffffff60,
                 (BUFFER_SET *)in_stack_ffffffffffffff58,(uint8_t *)in_stack_ffffffffffffff50,
                 (int)skip_txfm_sb_00);
      iVar3 = pick_interintra_wedge
                        (in_stack_0000ff58,in_stack_0000ff50,in_stack_0000ff4f,in_stack_0000ff40,
                         in_stack_0000ff38);
      *in_stack_00000008 = iVar3;
      for (in_stack_ffffffffffffff87 = 0;
          BVar4 = (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff10 >> 0x38),
          in_stack_ffffffffffffff87 < 4; in_stack_ffffffffffffff87 = in_stack_ffffffffffffff87 + 1)
      {
        in_stack_fffffffffffffef8 =
             (RD_STATS *)
             CONCAT44((int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                      (uint)in_stack_ffffffffffffff87);
        in_stack_ffffffffffffff00 =
             CONCAT44((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(uint)in_DL);
        compute_best_interintra_mode
                  ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58,(MACROBLOCKD *)in_stack_ffffffffffffff50,
                   (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (BUFFER_SET *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (uint8_t *)
                   CONCAT17(in_stack_ffffffffffffff87,
                            CONCAT61(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80)),
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (INTERINTRA_MODE *)CONCAT44(uVar1,uVar2),best_interintra_rd,
                   (INTERINTRA_MODE)skip_txfm_sb_00,(BLOCK_SIZE)skip_sse_sb_00);
      }
      *(char *)(*(long *)(tmp_rd_thresh + 0x88) + (long)*(char *)(in_RCX + 0x10)) = (char)*in_R9;
      *(char *)(in_RCX + 0x40) = (char)*in_R9;
      if ((char)*in_R9 != '\x03') {
        av1_build_intra_predictors_for_interintra
                  ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68,(BLOCK_SIZE)((uint)in_stack_ffffffffffffff64 >> 0x18),
                   in_stack_ffffffffffffff60,(BUFFER_SET *)in_stack_ffffffffffffff58,
                   (uint8_t *)in_stack_ffffffffffffff50,(int)skip_txfm_sb_00);
      }
      BVar5 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff3c >> 0x18);
    }
    else {
      *(char *)(in_RCX + 0x40) = (char)*in_R9;
      av1_build_intra_predictors_for_interintra
                ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,BVar5,in_stack_ffffffffffffff60,
                 (BUFFER_SET *)in_stack_ffffffffffffff58,(uint8_t *)in_stack_ffffffffffffff50,
                 (int)skip_txfm_sb_00);
      BVar5 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff3c >> 0x18);
      iVar3 = pick_interintra_wedge
                        (in_stack_0000ff58,in_stack_0000ff50,in_stack_0000ff4f,in_stack_0000ff40,
                         in_stack_0000ff38);
      *in_stack_00000008 = iVar3;
    }
  }
  else {
    iVar3 = pick_interintra_wedge
                      (in_stack_0000ff58,in_stack_0000ff50,in_stack_0000ff4f,in_stack_0000ff40,
                       in_stack_0000ff38);
    BVar5 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff3c >> 0x18);
    *in_stack_00000008 = iVar3;
  }
  *(int *)rd_stats._0_8_ =
       *(int *)(skip_txfm_sb_00 + (ulong)*(byte *)(in_RCX + 0x40) * 4) +
       *(int *)((long)skip_sse_sb_00 +
               (long)*(char *)(in_RCX + 0x41) * 4 + (ulong)in_DL * 0x40 + 0x40e8) +
       *(int *)((long)skip_sse_sb_00 + (ulong)in_DL * 8 + 0x468c);
  *in_stack_00000008 =
       ((long)(*(int *)rd_stats._0_8_ + (int)*in_R8) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9)
       + *in_stack_00000008;
  lVar7 = 0x7fffffffffffffff;
  uVar6 = *(undefined4 *)(in_RCX + 8);
  iVar9 = have_newmv_in_inter_mode(*(PREDICTION_MODE *)(in_RCX + 2));
  if (iVar9 != 0) {
    av1_get_contiguous_soft_mask(*(int8_t *)(in_RCX + 0x41),'\x01',in_DL);
    av1_compound_single_motion_search
              (in_stack_000001b8,in_stack_000001b0,in_stack_000001af,in_stack_000001a0,
               in_stack_00000198,in_stack_00000190,in_stack_000001d0,in_stack_000001d8,
               in_stack_000001e0);
    if (*(int *)(in_RCX + 8) != *(int *)rd_stats.dist) {
      *(undefined4 *)(in_RCX + 8) = *(undefined4 *)rd_stats.dist;
      *(undefined1 *)(in_RCX + 0x11) = 0xff;
      av1_enc_build_inter_predictor
                (in_stack_ffffffffffffff30,
                 (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,BVar4
                 ,in_stack_ffffffffffffff40,plane_rate[1]);
      BVar4 = (BLOCK_SIZE)((ulong)lVar7 >> 0x38);
      *(undefined1 *)(in_RCX + 0x11) = 0;
      av1_combine_interintra
                ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),BVar5,
                 in_stack_ffffffffffffff38,(uint8_t *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff2c,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff70);
      in_stack_fffffffffffffef8 = (RD_STATS *)0x0;
      in_stack_ffffffffffffff00 = 0;
      in_stack_ffffffffffffff08 = (MACROBLOCK *)0x0;
      model_rd_for_sb_with_curvfit
                ((AV1_COMP *)
                 CONCAT17(in_stack_ffffffffffffff87,
                          CONCAT61(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80)),BVar4,
                 (MACROBLOCK *)CONCAT44(uVar6,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,(int *)CONCAT44(uVar1,uVar2),
                 best_interintra_rd,skip_txfm_sb_00,skip_sse_sb_00,plane_rate,in_R9,in_R8);
      lVar7 = ((long)(*(int *)mode_rd + *(int *)rd_stats._0_8_ + in_stack_ffffffffffffff70) *
               (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60) * 0x80;
    }
  }
  if (*in_stack_00000008 <= lVar7) {
    *(undefined4 *)rd_stats.dist = uVar6;
    *(int *)mode_rd = (int)*in_R8;
    av1_combine_interintra
              ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),BVar5,
               in_stack_ffffffffffffff38,(uint8_t *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c,
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff70);
  }
  cpi_00 = (AV1_COMP *)
           ((long)(*(int *)rd_stats._0_8_ + *(int *)mode_rd) * (long)*(int *)(in_RSI + 0x4218) +
            0x100 >> 9);
  iVar3 = estimate_yrd_for_sb(cpi_00,(BLOCK_SIZE)((ulong)(rd_stats.rdcost - (long)cpi_00) >> 0x38),
                              in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8);
  if (iVar3 == 0x7fffffffffffffff) {
    if (*in_stack_00000008 == 0x7fffffffffffffff) {
      return -1;
    }
    lVar7 = 0x7fffffffffffffff;
  }
  else {
    lVar7 = ((long)(*(int *)rd_stats._0_8_ + *(int *)mode_rd + in_stack_ffffffffffffff20) *
             (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28) * 0x80;
  }
  *in_stack_00000008 = lVar7;
  return 0;
}

Assistant:

static int handle_wedge_inter_intra_mode(
    const AV1_COMP *const cpi, MACROBLOCK *const x, BLOCK_SIZE bsize,
    MB_MODE_INFO *mbmi, int *rate_mv, INTERINTRA_MODE *best_interintra_mode,
    int64_t *best_rd, const BUFFER_SET *orig_dst, uint8_t *tmp_buf_,
    uint8_t *tmp_buf, uint8_t *intrapred_, uint8_t *intrapred,
    HandleInterModeArgs *args, int *tmp_rate_mv, int *rate_overhead,
    int_mv *tmp_mv, int64_t best_rd_no_wedge) {
  MACROBLOCKD *xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *const interintra_mode_cost =
      mode_costs->interintra_mode_cost[size_group_lookup[bsize]];
  const AV1_COMMON *const cm = &cpi->common;
  const int bw = block_size_wide[bsize];
  const int try_smooth_interintra =
      cpi->oxcf.comp_type_cfg.enable_smooth_interintra;

  mbmi->use_wedge_interintra = 1;

  if (!cpi->sf.inter_sf.fast_interintra_wedge_search) {
    // Exhaustive search of all wedge and mode combinations.
    int best_mode = 0;
    int best_wedge_index = 0;
    *best_rd = compute_best_wedge_interintra(
        cpi, mbmi, xd, x, interintra_mode_cost, orig_dst, intrapred_, tmp_buf_,
        &best_mode, &best_wedge_index, bsize);
    mbmi->interintra_mode = best_mode;
    mbmi->interintra_wedge_index = best_wedge_index;
    if (best_mode != INTERINTRA_MODES - 1) {
      av1_build_intra_predictors_for_interintra(cm, xd, bsize, 0, orig_dst,
                                                intrapred, bw);
    }
  } else if (!try_smooth_interintra) {
    if (*best_interintra_mode == INTERINTRA_MODES) {
      mbmi->interintra_mode = INTERINTRA_MODES - 1;
      *best_interintra_mode = INTERINTRA_MODES - 1;
      av1_build_intra_predictors_for_interintra(cm, xd, bsize, 0, orig_dst,
                                                intrapred, bw);
      // Pick wedge mask based on INTERINTRA_MODES - 1
      *best_rd = pick_interintra_wedge(cpi, x, bsize, intrapred_, tmp_buf_);
      // Find the best interintra mode for the chosen wedge mask
      for (INTERINTRA_MODE cur_mode = 0; cur_mode < INTERINTRA_MODES;
           ++cur_mode) {
        compute_best_interintra_mode(
            cpi, mbmi, xd, x, interintra_mode_cost, orig_dst, intrapred,
            tmp_buf, best_interintra_mode, best_rd, cur_mode, bsize);
      }
      args->inter_intra_mode[mbmi->ref_frame[0]] = *best_interintra_mode;
      mbmi->interintra_mode = *best_interintra_mode;

      // Recompute prediction if required
      if (*best_interintra_mode != INTERINTRA_MODES - 1) {
        av1_build_intra_predictors_for_interintra(cm, xd, bsize, 0, orig_dst,
                                                  intrapred, bw);
      }
    } else {
      // Pick wedge mask for the best interintra mode (reused)
      mbmi->interintra_mode = *best_interintra_mode;
      av1_build_intra_predictors_for_interintra(cm, xd, bsize, 0, orig_dst,
                                                intrapred, bw);
      *best_rd = pick_interintra_wedge(cpi, x, bsize, intrapred_, tmp_buf_);
    }
  } else {
    // Pick wedge mask for the best interintra mode from smooth_interintra
    *best_rd = pick_interintra_wedge(cpi, x, bsize, intrapred_, tmp_buf_);
  }

  *rate_overhead =
      interintra_mode_cost[mbmi->interintra_mode] +
      mode_costs->wedge_idx_cost[bsize][mbmi->interintra_wedge_index] +
      mode_costs->wedge_interintra_cost[bsize][1];
  *best_rd += RDCOST(x->rdmult, *rate_overhead + *rate_mv, 0);

  int64_t rd = INT64_MAX;
  const int_mv mv0 = mbmi->mv[0];
  // Refine motion vector for NEWMV case.
  if (have_newmv_in_inter_mode(mbmi->mode)) {
    int rate_sum;
    uint8_t skip_txfm_sb;
    int64_t dist_sum, skip_sse_sb;
    // get negative of mask
    const uint8_t *mask =
        av1_get_contiguous_soft_mask(mbmi->interintra_wedge_index, 1, bsize);
    av1_compound_single_motion_search(cpi, x, bsize, &tmp_mv->as_mv, intrapred,
                                      mask, bw, tmp_rate_mv, 0);
    if (mbmi->mv[0].as_int != tmp_mv->as_int) {
      mbmi->mv[0].as_int = tmp_mv->as_int;
      // Set ref_frame[1] to NONE_FRAME temporarily so that the intra
      // predictor is not calculated again in av1_enc_build_inter_predictor().
      mbmi->ref_frame[1] = NONE_FRAME;
      const int mi_row = xd->mi_row;
      const int mi_col = xd->mi_col;
      av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                    AOM_PLANE_Y, AOM_PLANE_Y);
      mbmi->ref_frame[1] = INTRA_FRAME;
      av1_combine_interintra(xd, bsize, 0, xd->plane[AOM_PLANE_Y].dst.buf,
                             xd->plane[AOM_PLANE_Y].dst.stride, intrapred, bw);
      model_rd_sb_fn[MODELRD_TYPE_MASKED_COMPOUND](
          cpi, bsize, x, xd, 0, 0, &rate_sum, &dist_sum, &skip_txfm_sb,
          &skip_sse_sb, NULL, NULL, NULL);
      rd =
          RDCOST(x->rdmult, *tmp_rate_mv + *rate_overhead + rate_sum, dist_sum);
    }
  }
  if (rd >= *best_rd) {
    tmp_mv->as_int = mv0.as_int;
    *tmp_rate_mv = *rate_mv;
    av1_combine_interintra(xd, bsize, 0, tmp_buf, bw, intrapred, bw);
  }
  // Evaluate closer to true rd
  RD_STATS rd_stats;
  const int64_t mode_rd = RDCOST(x->rdmult, *rate_overhead + *tmp_rate_mv, 0);
  const int64_t tmp_rd_thresh = best_rd_no_wedge - mode_rd;
  rd = estimate_yrd_for_sb(cpi, bsize, x, tmp_rd_thresh, &rd_stats);
  if (rd != INT64_MAX) {
    rd = RDCOST(x->rdmult, *rate_overhead + *tmp_rate_mv + rd_stats.rate,
                rd_stats.dist);
  } else {
    if (*best_rd == INT64_MAX) return IGNORE_MODE;
  }
  *best_rd = rd;
  return 0;
}